

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

channel_s * fio_channel_dup_lock(fio_str_info_s name)

{
  int iVar1;
  uint64_t hashed;
  channel_s *ch_00;
  channel_s *ch_p;
  uint64_t hashed_name;
  channel_s ch;
  
  hashed_name = name.capa;
  ch.name_len = name.len;
  ch.name = (char *)0x8;
  memset(&ch.ref,0,0x10);
  ch.subscriptions.next = (fio_ls_embd_s *)&fio_postoffice.pubsub;
  ch.parent = (fio_collection_s *)0x0;
  ch.match._0_1_ = 0;
  hashed = fio_siphash13((void *)name.len,name.capa,0x1bac58,0x1bac58);
  ch_00 = fio_filter_dup_lock_internal((channel_s *)&hashed_name,hashed,&fio_postoffice.pubsub);
  iVar1 = fio_ls_embd_is_empty(&ch_00->subscriptions);
  if (iVar1 != 0) {
    fio_pubsub_on_channel_create(ch_00);
  }
  return ch_00;
}

Assistant:

static channel_s *fio_channel_dup_lock(fio_str_info_s name) {
  channel_s ch = (channel_s){
      .name = name.data,
      .name_len = name.len,
      .parent = &fio_postoffice.pubsub,
      .ref = 8, /* avoid freeing stack memory */
  };
  uint64_t hashed_name = FIO_HASH_FN(
      name.data, name.len, &fio_postoffice.pubsub, &fio_postoffice.pubsub);
  channel_s *ch_p =
      fio_filter_dup_lock_internal(&ch, hashed_name, &fio_postoffice.pubsub);
  if (fio_ls_embd_is_empty(&ch_p->subscriptions)) {
    fio_pubsub_on_channel_create(ch_p);
  }
  return ch_p;
}